

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alert.cpp
# Opt level: O0

void __thiscall
libtorrent::picker_log_alert::picker_log_alert
          (picker_log_alert *this,stack_allocator *alloc,torrent_handle *h,endpoint *ep,
          peer_id *peer_id,picker_flags_t flags,span<const_libtorrent::piece_block> blocks)

{
  torrent_handle *this_00;
  allocation_slot aVar1;
  piece_block *p;
  index_type iVar2;
  span<const_char> local_48;
  peer_id *local_38;
  peer_id *peer_id_local;
  endpoint *ep_local;
  torrent_handle *h_local;
  stack_allocator *alloc_local;
  picker_log_alert *this_local;
  picker_flags_t flags_local;
  
  local_38 = peer_id;
  peer_id_local = (peer_id *)ep;
  ep_local = (endpoint *)h;
  h_local = (torrent_handle *)alloc;
  alloc_local = (stack_allocator *)this;
  this_local._4_4_ = flags.m_val;
  peer_alert::peer_alert(&this->super_peer_alert,alloc,h,ep,peer_id);
  this_00 = h_local;
  (this->super_peer_alert).super_torrent_alert.super_alert._vptr_alert =
       (_func_int **)&PTR__picker_log_alert_00991ff0;
  *(uint *)&(this->super_peer_alert).field_0x9c = this_local._4_4_;
  p = span<const_libtorrent::piece_block>::data(&blocks);
  iVar2 = span<const_libtorrent::piece_block>::size(&blocks);
  span<const_char>::span(&local_48,(char *)p,iVar2 << 3);
  aVar1 = libtorrent::aux::stack_allocator::copy_buffer((stack_allocator *)this_00,local_48);
  (this->m_array_idx).m_idx = aVar1.m_idx;
  iVar2 = span<const_libtorrent::piece_block>::size(&blocks);
  this->m_num_blocks = (int)iVar2;
  return;
}

Assistant:

picker_log_alert::picker_log_alert(aux::stack_allocator& alloc, torrent_handle const& h
		, tcp::endpoint const& ep, peer_id const& peer_id, picker_flags_t const flags
		, span<piece_block const> blocks)
		: peer_alert(alloc, h, ep, peer_id)
		, picker_flags(flags)
		, m_array_idx(alloc.copy_buffer({reinterpret_cast<char const*>(blocks.data())
			, blocks.size() * int(sizeof(piece_block))}))
		, m_num_blocks(int(blocks.size()))
	{}